

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O2

vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_> *
__thiscall
minibag::View::getConnections
          (vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
           *__return_storage_ptr__,View *this)

{
  pointer ppMVar1;
  pointer ppMVar2;
  
  (__return_storage_ptr__->
  super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>::
  reserve(__return_storage_ptr__,
          (long)(this->ranges_).
                super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ranges_).
                super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3);
  ppMVar1 = (this->ranges_).
            super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar2 = (this->ranges_).
                 super__Vector_base<minibag::MessageRange_*,_std::allocator<minibag::MessageRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppMVar2 != ppMVar1;
      ppMVar2 = ppMVar2 + 1) {
    std::vector<const_minibag::ConnectionInfo_*,_std::allocator<const_minibag::ConnectionInfo_*>_>::
    push_back(__return_storage_ptr__,&(*ppMVar2)->connection_info);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const ConnectionInfo*> View::getConnections()
{
  std::vector<const ConnectionInfo*> connections;
  connections.reserve(ranges_.size());

  for (MessageRange* range : ranges_)
  {
    connections.push_back(range->connection_info);
  }

  return connections;
}